

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::EBMLHeader::Parse(EBMLHeader *this,IMkvReader *pReader,longlong *pos)

{
  int iVar1;
  longlong lVar2;
  long lVar3;
  long local_90;
  long local_80;
  longlong size;
  longlong id;
  longlong end;
  longlong result;
  longlong ebml_id;
  long len;
  uchar scan_byte;
  long lStack_48;
  uchar kEbmlByte0;
  longlong kMaxScanBytes;
  long status;
  longlong available;
  longlong total;
  longlong *pos_local;
  IMkvReader *pReader_local;
  EBMLHeader *this_local;
  
  if (pReader == (IMkvReader *)0x0) {
    this_local = (EBMLHeader *)0xfffffffffffffffe;
  }
  else {
    total = (longlong)pos;
    pos_local = (longlong *)pReader;
    pReader_local = (IMkvReader *)this;
    iVar1 = (*pReader->_vptr_IMkvReader[1])(pReader,&available,&status);
    kMaxScanBytes = (longlong)iVar1;
    this_local = (EBMLHeader *)kMaxScanBytes;
    if (-1 < kMaxScanBytes) {
      *(undefined8 *)total = 0;
      if (status < 0x400) {
        local_90 = status;
      }
      else {
        local_90 = 0x400;
      }
      lStack_48 = local_90;
      len._7_1_ = 0x1a;
      len._6_1_ = '\0';
      while (*(long *)total < lStack_48) {
        iVar1 = (**(code **)*pos_local)(pos_local,*(undefined8 *)total,1,(long)&len + 6);
        kMaxScanBytes = (longlong)iVar1;
        if (kMaxScanBytes < 0) {
          return kMaxScanBytes;
        }
        if (0 < kMaxScanBytes) {
          return -3;
        }
        if (len._6_1_ == '\x1a') break;
        *(long *)total = *(long *)total + 1;
      }
      ebml_id = 0;
      result = ReadID((IMkvReader *)pos_local,*(longlong *)total,&ebml_id);
      if (result == -3) {
        this_local = (EBMLHeader *)0xfffffffffffffffd;
      }
      else if ((ebml_id == 4) && (result == 0x1a45dfa3)) {
        *(long *)total = *(long *)total + 4;
        end = GetUIntLength((IMkvReader *)pos_local,*(longlong *)total,&ebml_id);
        if (end < 0) {
          this_local = (EBMLHeader *)0xfffffffffffffffe;
        }
        else if (end < 1) {
          if ((ebml_id < 1) || (8 < ebml_id)) {
            this_local = (EBMLHeader *)0xfffffffffffffffe;
          }
          else if ((available < 0) || (ebml_id <= available - *(long *)total)) {
            if (status - *(long *)total < ebml_id) {
              this_local = (EBMLHeader *)(*(long *)total + ebml_id);
            }
            else {
              end = ReadUInt((IMkvReader *)pos_local,*(longlong *)total,&ebml_id);
              this_local = (EBMLHeader *)end;
              if (-1 < end) {
                *(longlong *)total = ebml_id + *(long *)total;
                if ((available < 0) || (end <= available - *(long *)total)) {
                  if (status - *(long *)total < end) {
                    this_local = (EBMLHeader *)
                                 ((long)&((EBMLHeader *)end)->m_version + *(long *)total);
                  }
                  else {
                    id = (long)&((EBMLHeader *)end)->m_version + *(long *)total;
                    Init(this);
                    while (*(long *)total < id) {
                      kMaxScanBytes =
                           ParseElementHeader((IMkvReader *)pos_local,(longlong *)total,id,&size,
                                              &local_80);
                      if (kMaxScanBytes < 0) {
                        return kMaxScanBytes;
                      }
                      if (local_80 == 0) {
                        return -2;
                      }
                      if (size == 0x4286) {
                        lVar2 = UnserializeUInt((IMkvReader *)pos_local,*(longlong *)total,local_80)
                        ;
                        this->m_version = lVar2;
                        if (this->m_version < 1) {
                          return -2;
                        }
                      }
                      else if (size == 0x42f7) {
                        lVar2 = UnserializeUInt((IMkvReader *)pos_local,*(longlong *)total,local_80)
                        ;
                        this->m_readVersion = lVar2;
                        if (this->m_readVersion < 1) {
                          return -2;
                        }
                      }
                      else if (size == 0x42f2) {
                        lVar2 = UnserializeUInt((IMkvReader *)pos_local,*(longlong *)total,local_80)
                        ;
                        this->m_maxIdLength = lVar2;
                        if (this->m_maxIdLength < 1) {
                          return -2;
                        }
                      }
                      else if (size == 0x42f3) {
                        lVar2 = UnserializeUInt((IMkvReader *)pos_local,*(longlong *)total,local_80)
                        ;
                        this->m_maxSizeLength = lVar2;
                        if (this->m_maxSizeLength < 1) {
                          return -2;
                        }
                      }
                      else if (size == 0x4282) {
                        if (this->m_docType != (char *)0x0) {
                          return -2;
                        }
                        lVar3 = UnserializeString((IMkvReader *)pos_local,*(longlong *)total,
                                                  local_80,&this->m_docType);
                        if (lVar3 != 0) {
                          return lVar3;
                        }
                        kMaxScanBytes = 0;
                      }
                      else if (size == 0x4287) {
                        lVar2 = UnserializeUInt((IMkvReader *)pos_local,*(longlong *)total,local_80)
                        ;
                        this->m_docTypeVersion = lVar2;
                        if (this->m_docTypeVersion < 1) {
                          return -2;
                        }
                      }
                      else if (size == 0x4285) {
                        lVar2 = UnserializeUInt((IMkvReader *)pos_local,*(longlong *)total,local_80)
                        ;
                        this->m_docTypeReadVersion = lVar2;
                        if (this->m_docTypeReadVersion < 1) {
                          return -2;
                        }
                      }
                      *(long *)total = local_80 + *(long *)total;
                    }
                    if (*(long *)total == id) {
                      if (((this->m_docType == (char *)0x0) || (this->m_docTypeReadVersion < 1)) ||
                         (this->m_docTypeVersion < 1)) {
                        this_local = (EBMLHeader *)0xfffffffffffffffe;
                      }
                      else if (((this->m_maxIdLength < 1) || (4 < this->m_maxIdLength)) ||
                              ((this->m_maxSizeLength < 1 || (8 < this->m_maxSizeLength)))) {
                        this_local = (EBMLHeader *)0xfffffffffffffffe;
                      }
                      else {
                        this_local = (EBMLHeader *)0x0;
                      }
                    }
                    else {
                      this_local = (EBMLHeader *)0xfffffffffffffffe;
                    }
                  }
                }
                else {
                  this_local = (EBMLHeader *)0xfffffffffffffffe;
                }
              }
            }
          }
          else {
            this_local = (EBMLHeader *)0xfffffffffffffffe;
          }
        }
        else {
          this_local = (EBMLHeader *)0xfffffffffffffffd;
        }
      }
      else {
        this_local = (EBMLHeader *)0xfffffffffffffffe;
      }
    }
  }
  return (longlong)this_local;
}

Assistant:

long long EBMLHeader::Parse(IMkvReader* pReader, long long& pos) {
  if (!pReader)
    return E_FILE_FORMAT_INVALID;

  long long total, available;

  long status = pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  pos = 0;

  // Scan until we find what looks like the first byte of the EBML header.
  const long long kMaxScanBytes = (available >= 1024) ? 1024 : available;
  const unsigned char kEbmlByte0 = 0x1A;
  unsigned char scan_byte = 0;

  while (pos < kMaxScanBytes) {
    status = pReader->Read(pos, 1, &scan_byte);

    if (status < 0)  // error
      return status;
    else if (status > 0)
      return E_BUFFER_NOT_FULL;

    if (scan_byte == kEbmlByte0)
      break;

    ++pos;
  }

  long len = 0;
  const long long ebml_id = ReadID(pReader, pos, len);

  if (ebml_id == E_BUFFER_NOT_FULL)
    return E_BUFFER_NOT_FULL;

  if (len != 4 || ebml_id != libwebm::kMkvEBML)
    return E_FILE_FORMAT_INVALID;

  // Move read pos forward to the EBML header size field.
  pos += 4;

  // Read length of size field.
  long long result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error
    return E_FILE_FORMAT_INVALID;
  else if (result > 0)  // need more data
    return E_BUFFER_NOT_FULL;

  if (len < 1 || len > 8)
    return E_FILE_FORMAT_INVALID;

  if ((total >= 0) && ((total - pos) < len))
    return E_FILE_FORMAT_INVALID;

  if ((available - pos) < len)
    return pos + len;  // try again later

  // Read the EBML header size.
  result = ReadUInt(pReader, pos, len);

  if (result < 0)  // error
    return result;

  pos += len;  // consume size field

  // pos now designates start of payload

  if ((total >= 0) && ((total - pos) < result))
    return E_FILE_FORMAT_INVALID;

  if ((available - pos) < result)
    return pos + result;

  const long long end = pos + result;

  Init();

  while (pos < end) {
    long long id, size;

    status = ParseElementHeader(pReader, pos, end, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvEBMLVersion) {
      m_version = UnserializeUInt(pReader, pos, size);

      if (m_version <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvEBMLReadVersion) {
      m_readVersion = UnserializeUInt(pReader, pos, size);

      if (m_readVersion <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvEBMLMaxIDLength) {
      m_maxIdLength = UnserializeUInt(pReader, pos, size);

      if (m_maxIdLength <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvEBMLMaxSizeLength) {
      m_maxSizeLength = UnserializeUInt(pReader, pos, size);

      if (m_maxSizeLength <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDocType) {
      if (m_docType)
        return E_FILE_FORMAT_INVALID;

      status = UnserializeString(pReader, pos, size, m_docType);

      if (status)  // error
        return status;
    } else if (id == libwebm::kMkvDocTypeVersion) {
      m_docTypeVersion = UnserializeUInt(pReader, pos, size);

      if (m_docTypeVersion <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDocTypeReadVersion) {
      m_docTypeReadVersion = UnserializeUInt(pReader, pos, size);

      if (m_docTypeReadVersion <= 0)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;
  }

  if (pos != end)
    return E_FILE_FORMAT_INVALID;

  // Make sure DocType, DocTypeReadVersion, and DocTypeVersion are valid.
  if (m_docType == NULL || m_docTypeReadVersion <= 0 || m_docTypeVersion <= 0)
    return E_FILE_FORMAT_INVALID;

  // Make sure EBMLMaxIDLength and EBMLMaxSizeLength are valid.
  if (m_maxIdLength <= 0 || m_maxIdLength > 4 || m_maxSizeLength <= 0 ||
      m_maxSizeLength > 8)
    return E_FILE_FORMAT_INVALID;

  return 0;
}